

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::markOneDirectionInEdges(Graph *this)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  Edge *pEVar3;
  Graph *pGVar4;
  Edge **ppEVar5;
  
  resetEdgesMarking(this);
  pGVar4 = this;
  while (pVVar1 = pGVar4->verticesList, pVVar1 != (Vertex *)0x0) {
    ppEVar5 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar5, pEVar2 != (Edge *)0x0) {
      if (pEVar2->marked == false) {
        pEVar2->marked = false;
        pEVar3 = findEdge(this,pEVar2->destiny->id,pEVar2->origin->id);
        pEVar3->marked = true;
      }
      ppEVar5 = &pEVar2->nextEdge;
    }
    pGVar4 = (Graph *)&pVVar1->nextVertex;
  }
  return;
}

Assistant:

void Graph::markOneDirectionInEdges(){
    this->resetEdgesMarking();
    Edge *aux;
    for(Vertex *no = this->verticesList; no != NULL; no = no->getNext()){

        for(Edge *a = no->getEdgesList(); a != NULL; a = a->getNext()){

            if(a->getMarked() == false){
                a->setMarked(false);
                aux = this->findEdge(a->getDestiny()->getID(), a->getOrigin()->getID());
                aux->setMarked(true);
            }

        }
    }
}